

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

void __thiscall
scp::Tensor<std::complex<double>_>::_ndCooleyTukey
          (Tensor<std::complex<double>_> *this,complex<double> *beg,uint64_t order,
          complex<double> **bases)

{
  pointer *this_00;
  complex<double> *base_00;
  unsigned_long __x;
  uint64_t size_00;
  int iVar1;
  pointer stride;
  pair<unsigned_long,_unsigned_long> *factors_00;
  size_type factorCount;
  ulong *puVar2;
  __type _Var3;
  pointer local_a0;
  uint64_t i_2;
  undefined1 local_88 [8];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  factorsCopy;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  factors;
  uint64_t i_1;
  complex<double> *base;
  uint64_t i;
  uint64_t subLength;
  uint64_t *size;
  complex<double> **bases_local;
  uint64_t order_local;
  complex<double> *beg_local;
  Tensor<std::complex<double>_> *this_local;
  
  puVar2 = (this->_shape).sizes + ((this->_shape).order - order);
  iVar1 = std::accumulate<unsigned_long*,int,std::multiplies<unsigned_long>>
                    ((this->_shape).sizes + (this->_shape).order + (1 - order),
                     (this->_shape).sizes + (this->_shape).order,1);
  stride = (pointer)(long)iVar1;
  if (1 < order) {
    for (base = (complex<double> *)0x0; base < (complex<double> *)*puVar2;
        base = (complex<double> *)(base->_M_value + 1)) {
      _ndCooleyTukey(this,beg + (long)base * (long)stride,order - 1,bases);
    }
  }
  if (1 < *puVar2) {
    base_00 = bases[(this->_shape).order - order];
    if ((*puVar2 & *puVar2 - 1) == 0) {
      for (factors.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          factors.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage < stride;
          factors.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(factors.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1)) {
        __x = *puVar2;
        _Var3 = std::log2<unsigned_long>(__x);
        _scp::bitReversal<std::complex<double>>
                  (beg + (long)factors.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint64_t)stride,
                   __x,(uint8_t)(int)_Var3);
        _scp::cooleyTukeyRadix2<std::complex<double>>
                  (beg + (long)factors.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint64_t)stride,
                   base_00,1,*puVar2);
      }
    }
    else {
      this_00 = &factorsCopy.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)this_00);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)local_88);
      primeFactors<unsigned_long>
                (*puVar2,(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)this_00);
      for (local_a0 = (pointer)0x0; local_a0 < stride;
          local_a0 = (pointer)((long)&local_a0->first + 1)) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)local_88,
                    (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&factorsCopy.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        size_00 = *puVar2;
        factors_00 = std::
                     vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ::data((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             *)local_88);
        factorCount = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              *)local_88);
        _scp::cooleyTukey<std::complex<double>>
                  (beg + (long)local_a0,(uint64_t)stride,base_00,1,size_00,factors_00,factorCount);
      }
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)local_88);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&factorsCopy.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

constexpr void Tensor<TValue>::_ndCooleyTukey(TValue* beg, uint64_t order, const TValue* const* bases)
	{
		const uint64_t& size = *(_shape.sizes + _shape.order - order);
		
		const uint64_t subLength = std::accumulate(_shape.sizes + _shape.order - order + 1, _shape.sizes + _shape.order, 1, std::multiplies<uint64_t>());
		
		if (order > 1)
		{
			for (uint64_t i = 0; i < size; ++i)
			{
				_ndCooleyTukey(beg + i * subLength, order - 1, bases);
			}
		}

		if (size > 1)
		{
			const TValue* base = bases[_shape.order - order];

			if ((size & (size - 1)) == 0)
			{
				for (uint64_t i = 0; i < subLength; ++i)
				{
					_scp::bitReversal(beg + i, subLength, size, std::log2(size));
					_scp::cooleyTukeyRadix2(beg + i, subLength, base, 1, size);
				}
			}
			else
			{
				std::vector<std::pair<uint64_t, uint64_t>> factors, factorsCopy;
				primeFactors(size, factors);

				for (uint64_t i = 0; i < subLength; ++i)
				{
					factorsCopy = factors;
					_scp::cooleyTukey(beg + i, subLength, base, 1, size, factorsCopy.data(), factorsCopy.size());
				}
			}
		}
	}